

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDataServerCommand.cpp
# Opt level: O3

void __thiscall OpenDataServerCommand::~OpenDataServerCommand(OpenDataServerCommand *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_Command)._vptr_Command = (_func_int **)&PTR_execute_001167f0;
  close(this->client_socket);
  pcVar1 = (this->port_string)._M_dataplus._M_p;
  paVar2 = &(this->port_string).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

OpenDataServerCommand::~OpenDataServerCommand() {
  close(this->client_socket);
}